

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

void ForgetEmptyComponents
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                *components)

{
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  __it;
  
  __it._M_cur = (__node_type *)(components->_M_h)._M_before_begin._M_nxt;
  while (__it._M_cur != (__node_type *)0x0) {
    if (*(long *)(*(long *)((long)__it._M_cur + 0x28) + 0x1a0) == 0) {
      __it._M_cur = (__node_type *)
                    std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::erase(&components->_M_h,__it._M_cur);
    }
    else {
      __it._M_cur = *__it._M_cur;
    }
  }
  return;
}

Assistant:

void ForgetEmptyComponents(std::unordered_map<std::string, Component *> &components) {
  for (auto it = begin(components); it != end(components);) {
    if (it->second->files.empty())
      it = components.erase(it);
    else
      ++it;
  }
}